

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidationContextImpl.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::ValidationContextImpl::isPrefixUnknown(ValidationContextImpl *this,XMLCh *prefix)

{
  XMLCh XVar1;
  XMLCh XVar2;
  ElemStack *this_00;
  uint uVar3;
  XMLCh *pXVar4;
  XMLCh *pXVar5;
  undefined1 uVar6;
  bool unknown;
  bool local_9;
  
  local_9 = false;
  uVar6 = 1;
  if (prefix != L"xmlns") {
    pXVar4 = L"xmlns";
    pXVar5 = prefix;
    if (prefix == (XMLCh *)0x0) {
LAB_002be8d1:
      if (*pXVar4 == L'\0') {
        return true;
      }
    }
    else {
      do {
        XVar1 = *pXVar5;
        if (XVar1 == L'\0') goto LAB_002be8d1;
        XVar2 = *pXVar4;
        pXVar4 = pXVar4 + 1;
        pXVar5 = pXVar5 + 1;
      } while (XVar1 == XVar2);
    }
    uVar6 = local_9;
    if (prefix != L"xml") {
      pXVar4 = L"xml";
      pXVar5 = prefix;
      if (prefix == (XMLCh *)0x0) {
LAB_002be909:
        if (*pXVar4 == L'\0') {
          return false;
        }
      }
      else {
        do {
          XVar1 = *pXVar5;
          if (XVar1 == L'\0') goto LAB_002be909;
          XVar2 = *pXVar4;
          pXVar4 = pXVar4 + 1;
          pXVar5 = pXVar5 + 1;
        } while (XVar1 == XVar2);
      }
      this_00 = this->fElemStack;
      if ((this_00 == (ElemStack *)0x0) || (this_00->fStackTop == 0)) {
        if (this->fNamespaceScope != (NamespaceScope *)0x0) {
          uVar3 = (**(this->fNamespaceScope->super_XercesNamespaceResolver).
                     _vptr_XercesNamespaceResolver)();
          uVar6 = uVar3 == this->fNamespaceScope->fEmptyNamespaceId;
        }
      }
      else {
        ElemStack::mapPrefixToURI(this_00,prefix,&local_9);
        uVar6 = local_9;
      }
    }
  }
  return (bool)uVar6;
}

Assistant:

bool ValidationContextImpl::isPrefixUnknown(XMLCh* prefix) {
    bool unknown = false;
    if (XMLString::equals(prefix, XMLUni::fgXMLNSString)) {
        return true;
    }
    else if (!XMLString::equals(prefix, XMLUni::fgXMLString)) {
        if(fElemStack && !fElemStack->isEmpty())
            fElemStack->mapPrefixToURI(prefix, unknown);
        else if(fNamespaceScope)
            unknown = (fNamespaceScope->getNamespaceForPrefix(prefix)==fNamespaceScope->getEmptyNamespaceId());
    }
    return unknown;
}